

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

void __thiscall HVectorBase<double>::setup(HVectorBase<double> *this,HighsInt size_)

{
  undefined4 in_ESI;
  undefined4 *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  uint uVar1;
  undefined4 *__new_size;
  
  *in_RDI = in_ESI;
  in_RDI[1] = 0;
  __new_size = in_RDI;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,(size_type)in_RDI);
  std::vector<double,_std::allocator<double>_>::assign
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(size_type)in_RDI,
             (value_type_conflict1 *)0x7f6763);
  uVar1 = in_stack_ffffffffffffffe4 & 0xffffff;
  std::vector<char,_std::allocator<char>_>::assign
            ((vector<char,_std::allocator<char>_> *)
             (CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0) & 0xffffffffffffff),
             (size_type)in_RDI,(value_type_conflict *)0x7f6787);
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)((ulong)uVar1 << 0x20),(size_type)in_RDI,
             (value_type_conflict2 *)0x7f67ac);
  in_RDI[0x1f] = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,(size_type)__new_size);
  std::vector<double,_std::allocator<double>_>::resize(unaff_retaddr,(size_type)__new_size);
  *(undefined1 *)(in_RDI + 0x1e) = 0;
  *(undefined8 *)(in_RDI + 0xe) = 0;
  *(undefined8 *)(in_RDI + 0x1c) = 0;
  return;
}

Assistant:

void HVectorBase<Real>::setup(HighsInt size_) {
  /*
   * Initialise an HVector instance
   */
  size = size_;
  count = 0;
  index.resize(size);
  array.assign(size, Real{0});
  cwork.assign(size + 6400, 0);  // MAX invert
  iwork.assign(size * 4, 0);

  packCount = 0;
  packIndex.resize(size);
  packValue.resize(size);

  // Initialise three values that are initialised in clear(), but
  // weren't originally initialised in setup(). Probably doesn't
  // matter, since clear() is usually called before a vector is
  // (re-)used.
  packFlag = false;
  synthetic_tick = 0;
  next = 0;
}